

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O2

iterator __thiscall
gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::erase
          (rcu_list<int,_std::mutex,_std::allocator<int>_> *this,const_iterator iter)

{
  node *pnVar1;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar2;
  bool bVar3;
  zombie_list_node *in_RAX;
  pointer __p2;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar4;
  rcu_list<int,_std::mutex,_std::allocator<int>_> *prVar5;
  zombie_list_node *oldZombie;
  
  oldZombie = in_RAX;
  std::mutex::lock(&this->m_write_mutex);
  pnVar1 = ((iter.m_current)->next)._M_b._M_p;
  if ((iter.m_current)->deleted == false) {
    (iter.m_current)->deleted = true;
    prVar2 = (rcu_list<int,_std::mutex,_std::allocator<int>_> *)((iter.m_current)->back)._M_b._M_p;
    prVar4 = (rcu_list<int,_std::mutex,_std::allocator<int>_> *)((iter.m_current)->next)._M_b._M_p;
    prVar5 = prVar2;
    if (prVar2 == (rcu_list<int,_std::mutex,_std::allocator<int>_> *)0x0) {
      prVar5 = this;
    }
    LOCK();
    (prVar5->m_head)._M_b._M_p = (__pointer_type)prVar4;
    UNLOCK();
    if (prVar4 == (rcu_list<int,_std::mutex,_std::allocator<int>_> *)0x0) {
      prVar4 = this;
    }
    LOCK();
    (prVar4->m_tail)._M_b._M_p = (__pointer_type)prVar2;
    UNLOCK();
    __p2 = std::
           allocator_traits<std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::zombie_list_node>_>
           ::allocate((allocator_type *)&this->field_0x41,1);
    (__p2->next)._M_b._M_p = (__pointer_type)0x0;
    (__p2->owner)._M_b._M_p = (__pointer_type)0x0;
    __p2->zombie_node = iter.m_current;
    oldZombie = (this->m_zombie_head)._M_b._M_p;
    do {
      LOCK();
      (__p2->next)._M_b._M_p = oldZombie;
      UNLOCK();
      bVar3 = std::
              atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::zombie_list_node_*>
              ::compare_exchange_weak(&this->m_zombie_head,&oldZombie,__p2,memory_order_seq_cst);
    } while (!bVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_write_mutex);
  return (iterator)pnVar1;
}

Assistant:

auto rcu_list<T, M, Alloc>::erase(const_iterator iter) -> iterator
{
    std::lock_guard<M> guard(m_write_mutex);
    // make sure the node has not already been marked for deletion
    node* oldNextOrig = iter.m_current->next.load();
    if (!iter.m_current->deleted) {
        iter.m_current->deleted = true;

        node* oldPrev = iter.m_current->back.load();
        node* oldNext = iter.m_current->next.load();

        if (oldPrev) {
            oldPrev->next.store(oldNext);
        } else {
            // no previous node, this node was the head
            m_head.store(oldNext);
        }

        if (oldNext) {
            oldNext->back.store(oldPrev);
        } else {
            // no next node, this node was the tail
            m_tail.store(oldPrev);
        }

        auto newZombie = zombie_alloc_trait::allocate(m_zombie_alloc, 1);
        zombie_alloc_trait::construct(m_zombie_alloc,
                                      newZombie,
                                      iter.m_current);

        zombie_list_node* oldZombie = m_zombie_head.load();

        do {
            newZombie->next = oldZombie;
        } while (!m_zombie_head.compare_exchange_weak(oldZombie, newZombie));
    }

    return iterator(oldNextOrig);
}